

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local-graph.cpp
# Opt level: O0

void __thiscall
LocalGraphTest_ObstacleMultiblock_Test::TestBody(LocalGraphTest_ObstacleMultiblock_Test *this)

{
  bool bVar1;
  Err *pEVar2;
  char *pcVar3;
  reference this_00;
  pointer pFVar4;
  Block *pBVar5;
  Expression **ppEVar6;
  If *pIVar7;
  char *in_R9;
  AssertHelper local_7b8;
  Message local_7b0;
  uint local_7a4;
  LocalSet local_7a0;
  size_type local_768;
  undefined1 local_760 [8];
  AssertionResult gtest_ar_2;
  Message local_748;
  uint local_73c;
  LocalSet local_738;
  size_type local_700;
  undefined1 local_6f8 [8];
  AssertionResult gtest_ar_1;
  Message local_6e0;
  uint local_6d4;
  LocalSet local_6d0;
  size_type local_698;
  undefined1 local_690 [8];
  AssertionResult gtest_ar;
  undefined1 local_678 [8];
  LazyLocalGraph graph;
  Nop *nopC;
  Nop *nopB;
  Nop *nopA;
  If *iff;
  LocalSet *set;
  Block *block;
  Function *func;
  string local_4c8;
  AssertHelper local_4a8;
  Message local_4a0 [4];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_480;
  basic_string_view<char,_std::char_traits<char>_> local_458;
  Result<wasm::Ok> local_448 [47];
  bool local_419;
  undefined1 local_418 [8];
  AssertionResult gtest_ar_;
  Module wasm;
  char *moduleText;
  LocalGraphTest_ObstacleMultiblock_Test *this_local;
  
  wasm.tagsMap._M_h._M_single_bucket = (__node_base_ptr)anon_var_dwarf_1843d5;
  ::wasm::Module::Module((Module *)&gtest_ar_.message_);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_458,(char *)wasm.tagsMap._M_h._M_single_bucket);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::parseModule
            (local_448,&gtest_ar_.message_,local_458._M_len,local_458._M_str,&local_480);
  pEVar2 = ::wasm::Result<wasm::Ok>::getErr(local_448);
  local_419 = pEVar2 == (Err *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_418,&local_419,(type *)0x0);
  ::wasm::Result<wasm::Ok>::~Result(local_448);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_480);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_418);
  if (!bVar1) {
    testing::Message::Message(local_4a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_4c8,(internal *)local_418,
               (AssertionResult *)"WATParser::parseModule(wasm, moduleText).getErr()","true","false"
               ,in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4a8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/local-graph.cpp"
               ,0x52,pcVar3);
    testing::internal::AssertHelper::operator=(&local_4a8,local_4a0);
    testing::internal::AssertHelper::~AssertHelper(&local_4a8);
    std::__cxx11::string::~string((string *)&local_4c8);
    testing::Message::~Message(local_4a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_418);
  if (bVar1) {
    this_00 = std::
              vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ::operator[]((vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                            *)&wasm.exports.
                               super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
    pFVar4 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get(this_00);
    pBVar5 = ::wasm::Expression::cast<wasm::Block>(pFVar4->body);
    ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                        ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                         (pBVar5 + 0x20),0);
    ::wasm::Expression::cast<wasm::LocalSet>(*ppEVar6);
    ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                        ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                         (pBVar5 + 0x20),1);
    pIVar7 = ::wasm::Expression::cast<wasm::If>(*ppEVar6);
    ::wasm::Expression::cast<wasm::Nop>(*(Expression **)(pIVar7 + 0x18));
    ::wasm::Expression::cast<wasm::Nop>(*(Expression **)(pIVar7 + 0x18));
    ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                        ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                         (pBVar5 + 0x20),2);
    ::wasm::Expression::cast<wasm::Nop>(*ppEVar6);
    std::optional<wasm::Expression::Id>::optional<const_wasm::Expression::Id_&,_true>
              ((optional<wasm::Expression::Id> *)
               ((long)&gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 6),&::wasm::SpecificExpression<(wasm::Expression::Id)22>::SpecificId);
    ::wasm::LazyLocalGraph::LazyLocalGraph
              ((LazyLocalGraph *)local_678,pFVar4,&gtest_ar_.message_,
               gtest_ar.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl._6_2_);
    ::wasm::LazyLocalGraph::canMoveSet(&local_6d0,(Expression *)local_678);
    local_698 = std::
                unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>
                ::size((unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>
                        *)&local_6d0);
    local_6d4 = 1;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
              ((EqHelper *)local_690,"graph.canMoveSet(set, nopA).size()","1U",&local_698,&local_6d4
              );
    std::
    unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>
    ::~unordered_set((unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>
                      *)&local_6d0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_690);
    if (!bVar1) {
      testing::Message::Message(&local_6e0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_690);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/local-graph.cpp"
                 ,0x5d,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_6e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_6e0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_690);
    ::wasm::LazyLocalGraph::canMoveSet(&local_738,(Expression *)local_678);
    local_700 = std::
                unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>
                ::size((unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>
                        *)&local_738);
    local_73c = 1;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
              ((EqHelper *)local_6f8,"graph.canMoveSet(set, nopB).size()","1U",&local_700,&local_73c
              );
    std::
    unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>
    ::~unordered_set((unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>
                      *)&local_738);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6f8);
    if (!bVar1) {
      testing::Message::Message(&local_748);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_6f8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/local-graph.cpp"
                 ,0x5e,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_748);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_748);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_6f8);
    ::wasm::LazyLocalGraph::canMoveSet(&local_7a0,(Expression *)local_678);
    local_768 = std::
                unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>
                ::size((unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>
                        *)&local_7a0);
    local_7a4 = 0;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
              ((EqHelper *)local_760,"graph.canMoveSet(set, nopC).size()","0U",&local_768,&local_7a4
              );
    std::
    unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>
    ::~unordered_set((unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>
                      *)&local_7a0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_760);
    if (!bVar1) {
      testing::Message::Message(&local_7b0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_760);
      testing::internal::AssertHelper::AssertHelper
                (&local_7b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/local-graph.cpp"
                 ,0x60,pcVar3);
      testing::internal::AssertHelper::operator=(&local_7b8,&local_7b0);
      testing::internal::AssertHelper::~AssertHelper(&local_7b8);
      testing::Message::~Message(&local_7b0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_760);
    ::wasm::LazyLocalGraph::~LazyLocalGraph((LazyLocalGraph *)local_678);
  }
  ::wasm::Module::~Module((Module *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST_F(LocalGraphTest, ObstacleMultiblock) {
  auto moduleText = R"wasm(
    (module
      (func $foo (result i32)
        ;; An if between the set and get.
        (local $x i32)
        (local.set $x
          (i32.const 10)
        )
        (if
          (i32.const 42)
          (then
            (nop)
          )
          (else
            (nop)
          )
        )
        (nop)
        (local.get $x)
      )
    )
  )wasm";
  Module wasm;
  ASSERT_FALSE(WATParser::parseModule(wasm, moduleText).getErr());
  auto* func = wasm.functions[0].get();
  auto* block = func->body->cast<Block>();
  auto* set = block->list[0]->cast<LocalSet>();
  auto* iff = block->list[1]->cast<If>();
  auto* nopA = iff->ifTrue->cast<Nop>();
  auto* nopB = iff->ifTrue->cast<Nop>();
  auto* nopC = block->list[2]->cast<Nop>();

  LazyLocalGraph graph(func, &wasm, Nop::SpecificId);
  // No matter which if arm is an obstacle, we still connect.
  EXPECT_EQ(graph.canMoveSet(set, nopA).size(), 1U);
  EXPECT_EQ(graph.canMoveSet(set, nopB).size(), 1U);
  // But the nop after the if stops us.
  EXPECT_EQ(graph.canMoveSet(set, nopC).size(), 0U);
}